

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema_validator_factory_7.hpp
# Opt level: O3

void __thiscall
jsoncons::jsonschema::draft7::
schema_validator_factory_7<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
::schema_validator_factory_7
          (schema_validator_factory_7<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
           *this,basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *sch,
          validator_factory_factory_type *factory_factory,evaluation_options *options,
          schema_store_type *schema_store_ptr,
          vector<std::function<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_(const_jsoncons::uri_&)>,_std::allocator<std::function<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_(const_jsoncons::uri_&)>_>_>
          *resolve_funcs)

{
  string *version;
  string local_a0;
  evaluation_options local_80;
  
  schema_version::draft7_abi_cxx11_();
  evaluation_options::evaluation_options(&local_80,options);
  version = &local_a0;
  schema_validator_factory_base<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
  ::schema_validator_factory_base
            (&this->
              super_schema_validator_factory_base<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
             ,version,sch,factory_factory,&local_80,schema_store_ptr,resolve_funcs);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80.default_base_uri_._M_dataplus._M_p != &local_80.default_base_uri_.field_2) {
    version = (string *)(local_80.default_base_uri_.field_2._M_allocated_capacity + 1);
    operator_delete(local_80.default_base_uri_._M_dataplus._M_p,(ulong)version);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80.default_version_._M_dataplus._M_p != &local_80.default_version_.field_2) {
    version = (string *)(local_80.default_version_.field_2._M_allocated_capacity + 1);
    operator_delete(local_80.default_version_._M_dataplus._M_p,(ulong)version);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
    version = (string *)(local_a0.field_2._M_allocated_capacity + 1);
    operator_delete(local_a0._M_dataplus._M_p,(ulong)version);
  }
  (this->
  super_schema_validator_factory_base<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
  )._vptr_schema_validator_factory_base = (_func_int **)&PTR__schema_validator_factory_7_00b405b0;
  (this->keyword_factory_map_)._M_h._M_buckets = &(this->keyword_factory_map_)._M_h._M_single_bucket
  ;
  (this->keyword_factory_map_)._M_h._M_bucket_count = 1;
  (this->keyword_factory_map_)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->keyword_factory_map_)._M_h._M_element_count = 0;
  (this->keyword_factory_map_)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->keyword_factory_map_)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->keyword_factory_map_)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->factory_).factory_ =
       &this->
        super_schema_validator_factory_base<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
  ;
  init(this,(EVP_PKEY_CTX *)version);
  return;
}

Assistant:

schema_validator_factory_7(Json&& sch, const validator_factory_factory_type& factory_factory, 
            evaluation_options options, schema_store_type* schema_store_ptr,
            const std::vector<resolve_uri_type<Json>>& resolve_funcs) 
            : schema_validator_factory_base<Json>(schema_version::draft7(), std::move(sch), factory_factory, options, schema_store_ptr, resolve_funcs),
              factory_(this)
        {
            init();
        }